

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FileDescriptor * __thiscall
google::protobuf::FileDescriptor::dependency(FileDescriptor *this,int index)

{
  FileDescriptor *local_18;
  
  if (this->dependencies_once_ != (once_flag *)0x0) {
    local_18 = this;
    absl::lts_20250127::
    call_once<void(&)(google::protobuf::FileDescriptor_const*),google::protobuf::FileDescriptor_const*>
              (this->dependencies_once_,DependenciesOnceInit,&local_18);
  }
  return this->dependencies_[index];
}

Assistant:

const FileDescriptor* FileDescriptor::dependency(int index) const {
  if (dependencies_once_) {
    // Do once init for all indices, as it's unlikely only a single index would
    // be called, and saves on absl::call_once allocations.
    absl::call_once(*dependencies_once_, FileDescriptor::DependenciesOnceInit,
                    this);
  }
  return dependencies_[index];
}